

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

SocketAddress *
kj::anon_unknown_30::SocketAddress::getLocalAddress
          (SocketAddress *__return_storage_ptr__,int sockfd)

{
  int iVar1;
  Fault f;
  Fault local_20;
  
  memset(__return_storage_ptr__,0,0x88);
  __return_storage_ptr__->addrlen = 0x80;
  do {
    iVar1 = getsockname(sockfd,(sockaddr *)&(__return_storage_ptr__->addr).generic,
                        &__return_storage_ptr__->addrlen);
    if (-1 < iVar1) {
      return __return_storage_ptr__;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return __return_storage_ptr__;
  }
  _::Debug::Fault::Fault
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x310,iVar1,"getsockname(sockfd, &result.addr.generic, &result.addrlen)","");
  _::Debug::Fault::fatal(&local_20);
}

Assistant:

static SocketAddress getLocalAddress(int sockfd) {
    SocketAddress result;
    result.addrlen = sizeof(addr);
    KJ_SYSCALL(getsockname(sockfd, &result.addr.generic, &result.addrlen));
    return result;
  }